

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O3

void duckdb_je_prof_cnt_all(prof_cnt_t *cnt_all)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  malloc_mutex_t *pmVar3;
  int iVar4;
  tsd_t *tsd;
  size_t sVar5;
  _Bool even_if_attached;
  prof_tdata_t *tdata;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_02493488);
  tdata = (prof_tdata_t *)0x0;
  duckdb_je_tsd_fetch_slow(tsd,false);
  pmVar3 = tdata->lock;
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&pmVar3->field_0 + 0x48));
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(pmVar3);
    (pmVar3->field_0).field_0.locked.repr = true;
  }
  puVar1 = &(pmVar3->field_0).field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&((pmVar3->field_0).field_0.prof_data.prev_owner)->tsd != tsd) {
    *(tsd_t **)((long)&pmVar3->field_0 + 0x30) = tsd;
    ppwVar2 = &(pmVar3->field_0).witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (tdata->attached == true) {
    sVar5 = duckdb_je_ckh_count(&tdata->bt2tctx);
    if (sVar5 == 0) {
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata = (prof_tdata_t *)0x0;
      pmVar3 = tdata->lock;
      (pmVar3->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar3->field_0 + 0x48));
      prof_tdata_destroy(tsd,tdata,even_if_attached);
      return;
    }
    tdata->attached = false;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata = (prof_tdata_t *)0x0;
  }
  pmVar3 = tdata->lock;
  (pmVar3->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar3->field_0 + 0x48));
  return;
}

Assistant:

void
prof_cnt_all(prof_cnt_t *cnt_all) {
	tsd_t *tsd = tsd_fetch();
	prof_tdata_t *tdata = prof_tdata_get(tsd, false);
	if (tdata == NULL) {
		memset(cnt_all, 0, sizeof(prof_cnt_t));
	} else {
		size_t leak_ngctx;
		prof_gctx_tree_t gctxs;
		prof_dump_prep(tsd, tdata, cnt_all, &leak_ngctx, &gctxs);
		prof_gctx_finish(tsd, &gctxs);
	}
}